

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Vector4f operator*(Matrix4f *m,Vector4f *v)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  Vector4f *in_RDX;
  float *pfVar5;
  int i;
  long lVar6;
  int j;
  long lVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  Vector4f VVar10;
  
  auVar8 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar9 = ZEXT1664(ZEXT816(0) << 0x40);
  Vector4f::Vector4f((Vector4f *)m,0.0,0.0,0.0,0.0);
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    lVar7 = 0;
    pfVar5 = v->m_elements;
    while (lVar7 != 4) {
      fVar1 = *pfVar5;
      pfVar4 = Vector4f::operator[](in_RDX,(int)lVar7);
      fVar2 = *pfVar4;
      pfVar4 = Vector4f::operator[]((Vector4f *)m,(int)lVar6);
      auVar8 = ZEXT464((uint)fVar1);
      lVar7 = lVar7 + 1;
      pfVar5 = pfVar5 + 4;
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),ZEXT416((uint)*pfVar4));
      auVar9 = ZEXT1664(auVar3);
      *pfVar4 = auVar3._0_4_;
    }
    v = (Vector4f *)((long)v + 4);
  }
  VVar10.m_elements._0_8_ = auVar8._0_8_;
  VVar10.m_elements._8_8_ = auVar9._0_8_;
  return (Vector4f)VVar10.m_elements;
}

Assistant:

Vector4f operator * ( const Matrix4f& m, const Vector4f& v )
{
	Vector4f output( 0, 0, 0, 0 );

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			output[ i ] += m( i, j ) * v[ j ];
		}
	}

	return output;
}